

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

void objAppend(void *dest,void *src,size_t i)

{
  size_t count;
  void *dest_00;
  
  count = *src;
  dest_00 = (void *)(*dest + (long)dest);
  memMove(dest_00,src,count);
  objShiftPtrs(dest_00,(long)dest_00 - (long)src);
  *(long *)((long)dest + i * 8 + 0x18) = *dest + (long)dest;
  *(size_t *)dest = *dest + count;
  return;
}

Assistant:

void objAppend(void* dest, const void* src, size_t i)
{
	size_t t;
	// pre
	ASSERT(objIsOperable(src));
	ASSERT(objIsOperable(dest));
	ASSERT(memIsValid(objEnd(dest, void), objKeep(src)));
	ASSERT(i < objOCount(dest));
	// запомнить размер src
	t = objKeep(src);
	// скопировать src в конец dest
	objCopy(objEnd(dest, void), src);
	// установить ссылку на конец dest
	objPtr(dest, i, void) = objEnd(dest, void);
	// расширить dest
	objHdr(dest)->keep += t;
}